

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O2

bool __thiscall ElfFile::getSymbol(ElfFile *this,Elf32_Sym *symbol,size_t index)

{
  ByteArray *this_00;
  ElfSection *pEVar1;
  byte *pbVar2;
  Elf32_Word EVar3;
  Elf32_Addr EVar4;
  int iVar5;
  Endianness endianness;
  ulong pos;
  
  pEVar1 = this->symTab;
  if (pEVar1 != (ElfSection *)0x0) {
    this_00 = &pEVar1->data;
    pos = index * 0x10;
    endianness = (Endianness)((this->fileHeader).e_ident[5] != '\x02');
    EVar3 = ByteArray::getDoubleWord(this_00,pos,endianness);
    symbol->st_name = EVar3;
    EVar4 = ByteArray::getDoubleWord(this_00,pos + 4,endianness);
    symbol->st_value = EVar4;
    EVar3 = ByteArray::getDoubleWord(this_00,pos + 8,endianness);
    symbol->st_size = EVar3;
    pbVar2 = (pEVar1->data).data_;
    symbol->st_info = pbVar2[pos + 0xc];
    symbol->st_other = pbVar2[pos + 0xd];
    iVar5 = ByteArray::getWord(this_00,pos | 0xe,endianness);
    symbol->st_shndx = (Elf32_Half)iVar5;
  }
  return pEVar1 != (ElfSection *)0x0;
}

Assistant:

bool ElfFile::getSymbol(Elf32_Sym& symbol, size_t index)
{
	if (symTab == nullptr)
		return false;

	ByteArray &data = symTab->getData();
	size_t pos = index*sizeof(Elf32_Sym);
	Endianness endianness = getEndianness();
	symbol.st_name  = data.getDoubleWord(pos + 0x00, endianness);
	symbol.st_value = data.getDoubleWord(pos + 0x04, endianness);
	symbol.st_size  = data.getDoubleWord(pos + 0x08, endianness);
	symbol.st_info  = data[pos + 0x0C];
	symbol.st_other = data[pos + 0x0D];
	symbol.st_shndx = data.getWord(pos + 0x0E, endianness);

	return true;
}